

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-matrix.c
# Opt level: O1

_Bool plutovg_matrix_parse(plutovg_matrix_t *matrix,char *data,int length)

{
  byte *end;
  long lVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *it_1;
  byte *pbVar6;
  byte *pbVar7;
  _Bool _Var8;
  bool bVar9;
  float fVar10;
  char *it;
  plutovg_matrix_t m;
  float values [6];
  byte *local_98;
  plutovg_matrix_t local_90;
  float local_78;
  float fStack_74;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float local_60;
  float local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  matrix->a = 1.0;
  matrix->b = 0.0;
  matrix->c = 0.0;
  matrix->d = 1.0;
  matrix->e = 0.0;
  matrix->f = 0.0;
  if (length == -1) {
    sVar3 = strlen(data);
    length = (int)sVar3;
  }
  lVar4 = (long)length;
  end = (byte *)(data + lVar4);
  pbVar6 = (byte *)data;
  if (0 < length) {
    do {
      pbVar6 = (byte *)data;
      if ((0x20 < (ulong)(byte)*data) || ((0x100002600U >> ((ulong)(byte)*data & 0x3f) & 1) == 0))
      break;
      data = (char *)((byte *)data + 1);
      lVar4 = lVar4 + -1;
      pbVar6 = end;
    } while (lVar4 != 0);
  }
  _Var8 = true;
  do {
    if (end <= pbVar6) {
      return _Var8;
    }
    pcVar5 = "matrix" + ((long)end - (long)pbVar6);
    lVar4 = 0;
    do {
      if (lVar4 == 6) {
        pcVar5 = "";
        local_98 = pbVar6 + 6;
        break;
      }
      if (pbVar6[lVar4] != "matrix"[lVar4]) {
        pcVar5 = "matrix" + lVar4;
        local_98 = pbVar6 + lVar4;
        break;
      }
      lVar1 = lVar4 + 1;
      lVar4 = lVar4 + 1;
      local_98 = end;
    } while (pbVar6 + lVar1 != end);
    if (*pcVar5 == '\0') {
      iVar2 = parse_matrix_parameters((char **)&local_98,(char *)end,&local_78,6,0);
      if (iVar2 == 0) {
        return false;
      }
      local_90.a = local_78;
      local_90.b = fStack_74;
      local_90.c = local_70;
      local_90.d = fStack_6c;
      local_90.e = fStack_68;
      local_90.f = fStack_64;
    }
    else {
      if (pbVar6 < end) {
        pcVar5 = "translate" + ((long)end - (long)pbVar6);
        lVar4 = 0;
        do {
          if (lVar4 == 9) {
            pcVar5 = "";
            local_98 = pbVar6 + 9;
            break;
          }
          if (pbVar6[lVar4] != "translate"[lVar4]) {
            pcVar5 = "translate" + lVar4;
            local_98 = pbVar6 + lVar4;
            break;
          }
          lVar1 = lVar4 + 1;
          lVar4 = lVar4 + 1;
          local_98 = end;
        } while (pbVar6 + lVar1 != end);
      }
      else {
        pcVar5 = "translate";
        local_98 = pbVar6;
      }
      if (*pcVar5 == '\0') {
        iVar2 = parse_matrix_parameters((char **)&local_98,(char *)end,&local_78,1,1);
        if (iVar2 != 1) {
          if (iVar2 == 0) {
            return false;
          }
          local_90.a = 1.0;
          local_90.d = 1.0;
          local_90.e = local_78;
          local_90.f = fStack_74;
          goto LAB_00108558;
        }
        local_90.c = 0.0;
        local_90.e = local_78;
LAB_001087f9:
        local_90.d = 1.0;
        local_90.b = 0.0;
        local_90.a = 1.0;
        local_90.f = 0.0;
      }
      else {
        if (pbVar6 < end) {
          pcVar5 = "scale" + ((long)end - (long)pbVar6);
          lVar4 = 0;
          do {
            if (lVar4 == 5) {
              pcVar5 = "";
              local_98 = pbVar6 + 5;
              break;
            }
            if (pbVar6[lVar4] != "scale"[lVar4]) {
              pcVar5 = "scale" + lVar4;
              local_98 = pbVar6 + lVar4;
              break;
            }
            lVar1 = lVar4 + 1;
            lVar4 = lVar4 + 1;
            local_98 = end;
          } while (pbVar6 + lVar1 != end);
        }
        else {
          pcVar5 = "scale";
          local_98 = pbVar6;
        }
        if (*pcVar5 == '\0') {
          iVar2 = parse_matrix_parameters((char **)&local_98,(char *)end,&local_78,1,1);
          if (iVar2 == 1) {
            local_90.a = local_78;
            local_90.e = 0.0;
            local_90.f = 0.0;
            local_90.d = local_78;
          }
          else {
            if (iVar2 == 0) {
              return false;
            }
            local_90.a = local_78;
            local_90.e = 0.0;
            local_90.f = 0.0;
            local_90.d = fStack_74;
          }
LAB_00108558:
          local_90.c = 0.0;
          local_90.b = 0.0;
        }
        else {
          if (pbVar6 < end) {
            pcVar5 = "rotate" + ((long)end - (long)pbVar6);
            lVar4 = 0;
            do {
              if (lVar4 == 6) {
                pcVar5 = "";
                local_98 = pbVar6 + 6;
                break;
              }
              if (pbVar6[lVar4] != "rotate"[lVar4]) {
                pcVar5 = "rotate" + lVar4;
                local_98 = pbVar6 + lVar4;
                break;
              }
              lVar1 = lVar4 + 1;
              lVar4 = lVar4 + 1;
              local_98 = end;
            } while (pbVar6 + lVar1 != end);
          }
          else {
            pcVar5 = "rotate";
            local_98 = pbVar6;
          }
          if (*pcVar5 == '\0') {
            iVar2 = parse_matrix_parameters((char **)&local_98,(char *)end,&local_78,1,2);
            if (iVar2 == 3) {
              local_58 = ZEXT416((uint)fStack_74);
              local_48 = ZEXT416((uint)local_70);
              local_90.a = 1.0;
              local_90.b = 0.0;
              local_90.c = 0.0;
              local_90.d = 1.0;
              local_90.e = fStack_74;
              local_90.f = local_70;
              plutovg_matrix_multiply(matrix,&local_90,matrix);
              local_60 = local_78 * 0.017453292;
              local_5c = cosf(local_60);
              local_90.b = sinf(local_60);
              local_90.a = local_5c;
              local_90.c = -local_90.b;
              local_90.d = local_5c;
              local_90.e = 0.0;
              local_90.f = 0.0;
              plutovg_matrix_multiply(matrix,&local_90,matrix);
              local_90.e = -(float)local_58._0_4_;
              local_90.f = -(float)local_48._0_4_;
              local_90.a = 1.0;
              local_90.b = 0.0;
              local_90.c = 0.0;
              local_90.d = 1.0;
            }
            else {
              if (iVar2 == 0) {
                return false;
              }
              local_58._0_4_ = local_78 * 0.017453292;
              fVar10 = cosf(local_78 * 0.017453292);
              local_48._0_4_ = fVar10;
              local_90.b = sinf((float)local_58._0_4_);
              local_90.a = (float)local_48._0_4_;
              local_90.c = -local_90.b;
              local_90.d = (float)local_48._0_4_;
              local_90.e = 0.0;
              local_90.f = 0.0;
            }
          }
          else {
            if (pbVar6 < end) {
              pcVar5 = "skewX" + ((long)end - (long)pbVar6);
              lVar4 = 0;
              do {
                if (lVar4 == 5) {
                  pcVar5 = "";
                  local_98 = pbVar6 + 5;
                  break;
                }
                if (pbVar6[lVar4] != "skewX"[lVar4]) {
                  pcVar5 = "skewX" + lVar4;
                  local_98 = pbVar6 + lVar4;
                  break;
                }
                lVar1 = lVar4 + 1;
                lVar4 = lVar4 + 1;
                local_98 = end;
              } while (pbVar6 + lVar1 != end);
            }
            else {
              pcVar5 = "skewX";
              local_98 = pbVar6;
            }
            if (*pcVar5 == '\0') {
              iVar2 = parse_matrix_parameters((char **)&local_98,(char *)end,&local_78,1,0);
              if (iVar2 == 0) {
                return false;
              }
              local_90.c = tanf(local_78 * 0.017453292);
              local_90.e = 0.0;
              goto LAB_001087f9;
            }
            if (pbVar6 < end) {
              pcVar5 = "skewY" + ((long)end - (long)pbVar6);
              lVar4 = 0;
              do {
                if (lVar4 == 5) {
                  pcVar5 = "";
                  local_98 = pbVar6 + 5;
                  break;
                }
                if (pbVar6[lVar4] != "skewY"[lVar4]) {
                  pcVar5 = "skewY" + lVar4;
                  local_98 = pbVar6 + lVar4;
                  break;
                }
                lVar1 = lVar4 + 1;
                lVar4 = lVar4 + 1;
                local_98 = end;
              } while (pbVar6 + lVar1 != end);
            }
            else {
              pcVar5 = "skewY";
              local_98 = pbVar6;
            }
            if (*pcVar5 != '\0') {
              return false;
            }
            iVar2 = parse_matrix_parameters((char **)&local_98,(char *)end,&local_78,1,0);
            if (iVar2 == 0) {
              return false;
            }
            local_90.b = tanf(local_78 * 0.017453292);
            local_90.a = 1.0;
            local_90.c = 0.0;
            local_90.d = 1.0;
            local_90.e = 0.0;
            local_90.f = 0.0;
          }
        }
      }
    }
    plutovg_matrix_multiply(matrix,&local_90,matrix);
    bVar9 = local_98 < end;
    pbVar7 = local_98;
    if (bVar9) {
      bVar9 = true;
      pbVar6 = local_98;
      do {
        pbVar7 = pbVar6;
        if ((0x20 < (ulong)*pbVar6) || ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) == 0)) break;
        pbVar6 = pbVar6 + 1;
        bVar9 = pbVar6 < end;
        pbVar7 = end;
      } while (pbVar6 != end);
    }
    _Var8 = true;
    if (bVar9) {
      bVar9 = false;
      if (pbVar7 < end) {
        bVar9 = *pbVar7 == 0x2c;
        pbVar7 = pbVar7 + bVar9;
      }
      if (bVar9) {
        if (pbVar7 < end) {
          do {
            if ((0x20 < (ulong)*pbVar7) || ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) == 0))
            goto LAB_00108888;
            pbVar7 = pbVar7 + 1;
          } while (pbVar7 != end);
          _Var8 = false;
          pbVar7 = end;
        }
        else {
LAB_00108888:
          _Var8 = false;
        }
      }
    }
    pbVar6 = local_98;
    if (pbVar7 != local_98) {
      pbVar6 = pbVar7;
    }
  } while( true );
}

Assistant:

bool plutovg_matrix_parse(plutovg_matrix_t* matrix, const char* data, int length)
{
    float values[6];
    plutovg_matrix_init_identity(matrix);
    if(length == -1)
        length = strlen(data);
    const char* it = data;
    const char* end = it + length;
    bool has_trailing_comma = false;
    plutovg_skip_ws(&it, end);
    while(it < end) {
        if(plutovg_skip_string(&it, end, "matrix")) {
            int count = parse_matrix_parameters(&it, end, values, 6, 0);
            if(count == 0)
                return false;
            plutovg_matrix_t m = { values[0], values[1], values[2], values[3], values[4], values[5] };
            plutovg_matrix_multiply(matrix, &m, matrix);
        } else if(plutovg_skip_string(&it, end, "translate")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 1);
            if(count == 0)
                return false;
            if(count == 1) {
                plutovg_matrix_translate(matrix, values[0], 0);
            } else {
                plutovg_matrix_translate(matrix, values[0], values[1]);
            }
        } else if(plutovg_skip_string(&it, end, "scale")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 1);
            if(count == 0)
                return false;
            if(count == 1) {
                plutovg_matrix_scale(matrix, values[0], values[0]);
            } else {
                plutovg_matrix_scale(matrix, values[0], values[1]);
            }
        } else if(plutovg_skip_string(&it, end, "rotate")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 2);
            if(count == 0)
                return false;
            if(count == 3)
                plutovg_matrix_translate(matrix, values[1], values[2]);
            plutovg_matrix_rotate(matrix, PLUTOVG_DEG2RAD(values[0]));
            if(count == 3) {
                plutovg_matrix_translate(matrix, -values[1], -values[2]);
            }
        } else if(plutovg_skip_string(&it, end, "skewX")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 0);
            if(count == 0)
                return false;
            plutovg_matrix_shear(matrix, PLUTOVG_DEG2RAD(values[0]), 0);
        } else if(plutovg_skip_string(&it, end, "skewY")) {
            int count = parse_matrix_parameters(&it, end, values, 1, 0);
            if(count == 0)
                return false;
            plutovg_matrix_shear(matrix, 0, PLUTOVG_DEG2RAD(values[0]));
        } else {
            return false;
        }

        plutovg_skip_ws_or_comma(&it, end, &has_trailing_comma);
    }

    return !has_trailing_comma;
}